

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

double __thiscall
soplex::SPxScaler<double>::upperUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  double __x;
  long in_FS_OFFSET;
  double dVar1;
  
  dVar1 = (lp->super_LPColSetBase<double>).up.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  ::soplex::infinity::__tls_init();
  __x = (lp->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[i];
  if (*(double *)(in_FS_OFFSET + -8) <= dVar1) {
    return __x;
  }
  dVar1 = ldexp(__x,(lp->super_LPColSetBase<double>).scaleExp.data[i]);
  return dVar1;
}

Assistant:

R SPxScaler<R>::upperUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);

   if(lp.LPColSetBase<R>::upper(i) < R(infinity))
   {
      const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
      return spxLdexp(lp.LPColSetBase<R>::upper(i), colscaleExp[i]);
   }
   else
      return lp.LPColSetBase<R>::upper(i);
}